

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::
     handle_cstring_type_spec<char,fmt::v7::detail::cstring_type_checker<fmt::v7::detail::error_handler>>
               (char spec,cstring_type_checker<fmt::v7::detail::error_handler> *handler)

{
  cstring_type_checker<fmt::v7::detail::error_handler> *in_RSI;
  char in_DIL;
  error_handler *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  
  if ((in_DIL == '\0') || (in_DIL == 's')) {
    cstring_type_checker<fmt::v7::detail::error_handler>::on_string(in_RSI);
  }
  else {
    if (in_DIL != 'p') {
      error_handler::on_error(unaff_retaddr,(char *)CONCAT17(in_DIL,in_stack_fffffffffffffff8));
    }
    cstring_type_checker<fmt::v7::detail::error_handler>::on_pointer(in_RSI);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}